

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

void __thiscall
pstore::sparse_array<int,pstore::uint128>::sparse_array<unsigned_long*,int*>
          (sparse_array<int,pstore::uint128> *this,unsigned_long *first_index,
          unsigned_long *last_index,int *first_value,int *last_value)

{
  uint128 *puVar1;
  undefined8 extraout_RDX;
  sparse_array<int,pstore::uint128> *local_38;
  int *out;
  int *last_value_local;
  int *first_value_local;
  unsigned_long *last_index_local;
  unsigned_long *first_index_local;
  sparse_array<int,_pstore::uint128> *this_local;
  
  puVar1 = bitmap<unsigned_long*,void>
                     ((uint128 *)first_index,(sparse_array<int,pstore::uint128> *)last_index,
                      last_index,(unsigned_long *)first_value);
  *(uint128 **)this = puVar1;
  *(undefined8 *)(this + 8) = extraout_RDX;
  last_value_local = first_value;
  last_index_local = first_index;
  if (first_index != last_index) {
    if (first_value != last_value) {
      last_value_local = first_value + 1;
      *(int *)(this + 0x10) = *first_value;
    }
    last_index_local = first_index + 1;
  }
  local_38 = this + 0x14;
  for (; last_index_local != last_index && last_value_local != last_value;
      last_index_local = last_index_local + 1) {
    *(int *)local_38 = *last_value_local;
    last_value_local = last_value_local + 1;
    local_38 = local_38 + 4;
  }
  for (; last_index_local != last_index; last_index_local = last_index_local + 1) {
    *(undefined4 *)local_38 = 0;
    local_38 = local_38 + 4;
  }
  return;
}

Assistant:

sparse_array<ValueType, BitmapType>::sparse_array (IteratorIdx first_index,
                                                       IteratorIdx last_index,
                                                       IteratorV first_value, IteratorV last_value)
            : bitmap_{bitmap (first_index, last_index)} {

        // Deal with the first element. This is the odd-one-out becuase it's in the
        // declaration of the object and will have been default-constructed by the
        // compiler.
        if (first_index != last_index) {
            if (first_value != last_value) {
                elements_[0] = *(first_value++);
            }
            ++first_index;
        }

        auto out = &elements_[1];

        // Now construct any remaining elements into the uninitialized memory past the
        // end of the object using placement new.
        for (; first_index != last_index && first_value != last_value;
             ++first_index, ++first_value, ++out) {
            new (out) ValueType (*first_value);
        }
        // Default-construct any remaining objects for which we don't have a value.
        for (; first_index != last_index; ++first_index, ++out) {
            new (out) ValueType ();
        }
    }